

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor_injection_ambiguous_constructors_via_BOOST_DI_INJECT_TRAITS.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this_00;
  dependency_conflict args_1;
  T TVar1;
  T object;
  int local_30;
  scope<int,_int,_int> local_2c;
  undefined1 local_28 [8];
  i injector;
  
  injector.super_injector_t._20_4_ = 0;
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<int>);
  local_30 = 0x2a;
  local_2c.object_ =
       (int)boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::to<int,_0,_0>(this,&local_30);
  this_00 = boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                          *)&boost::ext::di::v1_3_0::bind<double>);
  object.d = 87.0;
  args_1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::to<double,_0,_0>(this_00,&object.d);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ((i *)local_28,
             (dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              )local_2c.object_,
             (dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              )args_1.super_scope<double,_double,_int>.object_);
  TVar1 = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          ::create<T,_0>((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                          *)local_28);
  object._0_8_ = TVar1.d;
  if (TVar1.a != 0x2a) {
    __assert_fail("42 == object.a",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/constructor_injection_ambiguous_constructors_via_BOOST_DI_INJECT_TRAITS.cpp"
                  ,0x1f,"int main()");
  }
  if (((double)object._0_8_ == 87.0) && (!NAN((double)object._0_8_))) {
    return injector.super_injector_t._20_4_;
  }
  __assert_fail("87.0 == object.d",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/constructor_injection_ambiguous_constructors_via_BOOST_DI_INJECT_TRAITS.cpp"
                ,0x20,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().to(42)
  , di::bind<double>().to(87.0)
  );
  // clang-format on
  auto object = injector.create<T>();
  assert(42 == object.a);
  assert(87.0 == object.d);
}